

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_feature_helper.h
# Opt level: O2

JavaFeatures * __thiscall
google::protobuf::internal::InternalFeatureHelper::
GetResolvedFeatureExtension<google::protobuf::FileDescriptor,pb::JavaFeatures,(unsigned_char)11,false>
          (JavaFeatures *__return_storage_ptr__,InternalFeatureHelper *this,
          FileDescriptor *descriptor,
          ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
          *extension)

{
  bool bVar1;
  Edition EVar2;
  ConstType pJVar3;
  Edition in_R8D;
  string_view data;
  JavaFeatures lang_features;
  JavaFeatures lang_features_ret;
  JavaFeatures JStack_b8;
  JavaFeatures local_90;
  FeatureSet local_68;
  
  pJVar3 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false,_0>
                     (*(FeatureSet **)(this + 0x90),
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
                       *)descriptor);
  pb::JavaFeatures::JavaFeatures(&JStack_b8,pJVar3);
  bVar1 = DescriptorPool::
          ResolvesFeaturesFor<google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,(unsigned_char)11,false>
                    (*(DescriptorPool **)(this + 0x18),
                     (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
                      *)descriptor);
  if (bVar1) {
    pb::JavaFeatures::JavaFeatures(__return_storage_ptr__,&JStack_b8);
  }
  else {
    EVar2 = FileDescriptor::edition((FileDescriptor *)this);
    data._M_str._0_4_ = EVar2;
    data._M_len = (size_t)
                  "CicYhAciA8o+ACodCAEQAhgCIAMoATACOAJAAco+CggBEAEYACABKAMKJxjnByIDyj4AKh0IAhABGAEgAigBMAE4AkAByj4KCAAQARgAIAEoAwonGOgHIhMIARABGAEgAigBMAHKPgQIABABKg04AkAByj4GGAAgASgDIOYHKOgH"
    ;
    data._M_str._4_4_ = 0;
    ParseAndGetEditionResolvedFeatureSet(&local_68,(InternalFeatureHelper *)0xac,data,in_R8D);
    pJVar3 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false,_0>
                       (&local_68,
                        (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
                         *)descriptor);
    pb::JavaFeatures::JavaFeatures(&local_90,pJVar3);
    FeatureSet::~FeatureSet(&local_68);
    pb::JavaFeatures::MergeImpl((MessageLite *)&local_90,(MessageLite *)&JStack_b8);
    pb::JavaFeatures::JavaFeatures(__return_storage_ptr__,&local_90);
    pb::JavaFeatures::~JavaFeatures(&local_90);
  }
  pb::JavaFeatures::~JavaFeatures(&JStack_b8);
  return __return_storage_ptr__;
}

Assistant:

static auto GetResolvedFeatureExtension(
      const DescriptorT& descriptor,
      const google::protobuf::internal::ExtensionIdentifier<
          FeatureSet, MessageTypeTraits<ExtType>, field_type, is_packed>&
          extension) {
    auto lang_features = GetFeatures(descriptor).GetExtension(extension);
    if (GetDescriptorPool(descriptor).ResolvesFeaturesFor(extension)) {
      return lang_features;
    }

    auto lang_features_ret =
        ParseAndGetEditionResolvedFeatureSet(
            ::pb::internal::GetFeatureSetDefaultsData<ExtType>(),
            GetEdition(descriptor))
            .GetExtension(extension);
    lang_features_ret.MergeFrom(lang_features);
    return lang_features_ret;
  }